

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

void __thiscall duckdb::DuckTransaction::~DuckTransaction(DuckTransaction *this)

{
  ~DuckTransaction(this);
  operator_delete(this);
  return;
}

Assistant:

DuckTransaction::~DuckTransaction() {
}